

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
write_int<long_long,fmt::v5::basic_format_specs<char>>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,longlong value,basic_format_specs<char> *spec)

{
  long in_RDX;
  int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *in_stack_ffffffffffffffb8;
  char spec_00;
  basic_format_specs<char> *in_stack_ffffffffffffffc8;
  longlong in_stack_ffffffffffffffd0;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffd8;
  int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *in_stack_ffffffffffffffe0;
  
  spec_00 = *(char *)(in_RDX + 0x11);
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  ::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::int_writer
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  internal::
  handle_int_type_spec<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>>
            (spec_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type,
                                   int_writer<T, Spec>(*this, value, spec));
  }